

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConsoleTable.cpp
# Opt level: O1

void __thiscall ConsoleTable::setStyle(ConsoleTable *this,uint n)

{
  std::__cxx11::string::_M_assign((string *)&this->style);
  std::__cxx11::string::_M_assign((string *)&(this->style).vertical);
  std::__cxx11::string::_M_assign((string *)&(this->style).top);
  std::__cxx11::string::_M_assign((string *)&(this->style).top.intersect);
  std::__cxx11::string::_M_assign((string *)&(this->style).top.right);
  std::__cxx11::string::_M_assign((string *)&(this->style).middle);
  std::__cxx11::string::_M_assign((string *)&(this->style).middle.intersect);
  std::__cxx11::string::_M_assign((string *)&(this->style).middle.right);
  std::__cxx11::string::_M_assign((string *)&(this->style).bottom);
  std::__cxx11::string::_M_assign((string *)&(this->style).bottom.intersect);
  std::__cxx11::string::_M_assign((string *)&(this->style).bottom.right);
  return;
}

Assistant:

void ConsoleTable::setStyle(unsigned int n) {
    switch (n) {
        case 0 :
            style = BasicStyle;
            break;
        case 1 :
            style = LineStyle;
            break;
        case 2 :
            style = DoubleLineStyle;
            break;
        case 3 :
            style = InvisibleStyle;
            break;
        default :
            style = BasicStyle;
            break;
    }
}